

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O3

int WebRtcNs_set_policy_core(NoiseSuppressionC *self,int mode)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  iVar1 = -1;
  if ((uint)mode < 4) {
    self->aggrMode = mode;
    if (mode == 3) {
      iVar1 = 1;
      fVar4 = 0.09;
      fVar3 = 1.25;
    }
    else {
      uVar2 = (ulong)(uint)mode;
      fVar3 = *(float *)(&DAT_001ad4b0 + uVar2 * 4);
      fVar4 = *(float *)(&DAT_001ad4bc + uVar2 * 4);
      iVar1 = *(int *)(&DAT_001ad4c8 + uVar2 * 4);
    }
    self->overdrive = fVar3;
    self->denoiseBound = fVar4;
    self->gainmap = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int WebRtcNs_set_policy_core(NoiseSuppressionC* self, int mode) {
  // Allow for modes: 0, 1, 2, 3.
  if (mode < 0 || mode > 3) {
    return (-1);
  }

  self->aggrMode = mode;
  if (mode == 0) {
    self->overdrive = 1.f;
    self->denoiseBound = 0.5f;
    self->gainmap = 0;
  } else if (mode == 1) {
    // self->overdrive = 1.25f;
    self->overdrive = 1.f;
    self->denoiseBound = 0.25f;
    self->gainmap = 1;
  } else if (mode == 2) {
    // self->overdrive = 1.25f;
    self->overdrive = 1.1f;
    self->denoiseBound = 0.125f;
    self->gainmap = 1;
  } else if (mode == 3) {
    // self->overdrive = 1.3f;
    self->overdrive = 1.25f;
    self->denoiseBound = 0.09f;
    self->gainmap = 1;
  }
  return 0;
}